

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_lyb.c
# Opt level: O3

void lyb_read(uint8_t *buf,size_t count,lylyb_ctx *lybctx)

{
  lyd_lyb_sibling *plVar1;
  ulong in_RAX;
  ulong uVar2;
  lyd_lyb_sibling *plVar3;
  ulong uVar4;
  lyd_lyb_sibling *plVar5;
  ulong uVar6;
  uint8_t meta_buf [4];
  undefined8 uStack_38;
  
  if (lybctx == (lylyb_ctx *)0x0) {
    __assert_fail("lybctx",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_lyb.c"
                  ,0x76,"void lyb_read(uint8_t *, size_t, struct lylyb_ctx *)");
  }
  uStack_38 = in_RAX;
  while( true ) {
    plVar1 = lybctx->siblings;
    uVar4 = 0;
    plVar5 = (lyd_lyb_sibling *)0x0;
    plVar3 = plVar1;
    uVar2 = count;
    while( true ) {
      if (plVar1 == (lyd_lyb_sibling *)0x0) {
        uVar6 = 0;
      }
      else {
        uVar6 = *(ulong *)&plVar1[-1].inner_chunks;
      }
      if (uVar6 <= uVar4) break;
      if ((plVar3->written <= uVar2) && (plVar3->position != 0)) {
        plVar5 = plVar3;
        uVar2 = plVar3->written;
      }
      uVar4 = uVar4 + 1;
      plVar3 = plVar3 + 1;
    }
    if ((plVar5 == (lyd_lyb_sibling *)0x0) && (count == 0)) break;
    if (uVar2 != 0) {
      if (buf == (uint8_t *)0x0) {
        ly_in_skip(lybctx->in,uVar2);
      }
      else {
        ly_in_read(lybctx->in,buf,uVar2);
      }
      plVar1 = lybctx->siblings;
      uVar4 = 0xffffffffffffffff;
      plVar3 = plVar1;
      while( true ) {
        if (plVar1 == (lyd_lyb_sibling *)0x0) {
          uVar6 = 0;
        }
        else {
          uVar6 = *(ulong *)&plVar1[-1].inner_chunks;
        }
        uVar4 = uVar4 + 1;
        if (uVar6 <= uVar4) break;
        uVar6 = plVar3->written - uVar2;
        plVar3->written = uVar6;
        plVar3 = plVar3 + 1;
        if (0xffff < uVar6) {
          __assert_fail("lybctx->siblings[u].written <= LYB_SIZE_MAX",
                        "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_lyb.c"
                        ,0x95,"void lyb_read(uint8_t *, size_t, struct lylyb_ctx *)");
        }
      }
      count = count - uVar2;
      if (buf != (uint8_t *)0x0) {
        buf = buf + uVar2;
      }
    }
    if (plVar5 != (lyd_lyb_sibling *)0x0) {
      ly_in_read(lybctx->in,(void *)((long)&uStack_38 + 4),4);
      uVar2 = uStack_38 >> 0x20 & 0xffff;
      plVar5->written = uVar2;
      plVar5->inner_chunks = uStack_38._6_2_;
      plVar5->position = (ulong)(uVar2 == 0xffff);
    }
  }
  return;
}

Assistant:

static void
lyb_read(uint8_t *buf, size_t count, struct lylyb_ctx *lybctx)
{
    LY_ARRAY_COUNT_TYPE u;
    struct lyd_lyb_sibling *empty;
    size_t to_read;

    assert(lybctx);

    while (1) {
        /* check for fully-read (empty) data chunks */
        to_read = count;
        empty = NULL;
        LY_ARRAY_FOR(lybctx->siblings, u) {
            /* we want the innermost chunks resolved first, so replace previous empty chunks,
             * also ignore chunks that are completely finished, there is nothing for us to do */
            if ((lybctx->siblings[u].written <= to_read) && lybctx->siblings[u].position) {
                /* empty chunk, do not read more */
                to_read = lybctx->siblings[u].written;
                empty = &lybctx->siblings[u];
            }
        }

        if (!empty && !count) {
            break;
        }

        /* we are actually reading some data, not just finishing another chunk */
        if (to_read) {
            if (buf) {
                ly_in_read(lybctx->in, buf, to_read);
            } else {
                ly_in_skip(lybctx->in, to_read);
            }

            LY_ARRAY_FOR(lybctx->siblings, u) {
                /* decrease all written counters */
                lybctx->siblings[u].written -= to_read;
                assert(lybctx->siblings[u].written <= LYB_SIZE_MAX);
            }
            /* decrease count/buf */
            count -= to_read;
            if (buf) {
                buf += to_read;
            }
        }

        if (empty) {
            /* read the next chunk meta information */
            lyb_read_sibling_meta(empty, lybctx);
        }
    }
}